

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O0

void e_died(entity *etmp,int dest,int how)

{
  boolean bVar1;
  int how_00;
  char *pcVar2;
  bool bVar3;
  int local_20;
  coord local_1a;
  int entitycnt;
  int iStack_14;
  coord xy;
  int how_local;
  int dest_local;
  entity *etmp_local;
  
  entitycnt = how;
  iStack_14 = dest;
  if (etmp->emon == &youmonst) {
    if (how == 4) {
      killer = (char *)0x0;
      drown();
    }
    else if (how == 5) {
      killer = (char *)0x0;
      lava_effects();
    }
    else {
      if (killer == (char *)0x0) {
        killer_format = 0;
        killer = "falling drawbridge";
      }
      done(how);
      bVar1 = e_survives_at(etmp,etmp->ex,etmp->ey);
      if ((bVar1 == '\0') &&
         (bVar1 = enexto(&local_1a,level,(xchar)etmp->ex,(xchar)etmp->ey,etmp->edata), bVar1 != '\0'
         )) {
        bVar3 = false;
        if (u.uprops[0x23].intrinsic != 0) {
          bVar3 = true;
          if ((u.uprops[0x24].extrinsic == 0) && (bVar3 = false, u.umonnum != u.umonster)) {
            bVar1 = dmgtype(youmonst.data,0x24);
            bVar3 = bVar1 != '\0';
          }
          bVar3 = (bool)(bVar3 ^ 1);
        }
        pcVar2 = "strange";
        if (bVar3) {
          pcVar2 = "normal";
        }
        pline("A %s force teleports you away...",pcVar2);
        teleds((int)local_1a.x,(int)local_1a.y,'\0');
      }
    }
    etmp->ex = (int)u.ux;
    etmp->ey = (int)u.uy;
  }
  else {
    killer = (char *)0x0;
    if (flags.mon_moving == '\0') {
      xkilled(etmp->emon,dest);
    }
    else {
      pcVar2 = (char *)0x0;
      if ((dest & 1U) != 0) {
        pcVar2 = "";
      }
      how_00 = 0;
      if ((dest & 2U) != 0) {
        how_00 = 0x1a;
      }
      monkilled(etmp->emon,pcVar2,how_00);
    }
    etmp->edata = (permonst *)0x0;
    for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
      if ((etmp != occupants + local_20) && (etmp->emon == occupants[local_20].emon)) {
        occupants[local_20].edata = (permonst *)0x0;
      }
    }
  }
  return;
}

Assistant:

static void e_died(struct entity *etmp, int dest, int how)
{
	if (is_u(etmp)) {
		if (how == DROWNING) {
			killer = 0;	/* drown() sets its own killer */
			drown();
		} else if (how == BURNING) {
			killer = 0;	/* lava_effects() sets its own killer */
			lava_effects();
		} else {
			coord xy;

			/* use more specific killer if specified */
			if (!killer) {
			    killer_format = KILLED_BY_AN;
			    killer = "falling drawbridge";
			}
			done(how);
			/* So, you didn't die */
			if (!e_survives_at(etmp, etmp->ex, etmp->ey)) {
			    if (enexto(&xy, level, etmp->ex, etmp->ey, etmp->edata)) {
				pline("A %s force teleports you away...",
				      Hallucination ? "normal" : "strange");
				teleds(xy.x, xy.y, FALSE);
			    }
			    /* otherwise on top of the drawbridge is the
			     * only viable spot in the dungeon, so stay there
			     */
			}
		}
		/* we might have crawled out of the moat to survive */
		etmp->ex = u.ux,  etmp->ey = u.uy;
	} else {
		int entitycnt;

		killer = 0;
		/* fake "digested to death" damage-type suppresses corpse */
#define mk_message(dest) ((dest & 1) ? "" : NULL)
#define mk_corpse(dest)  ((dest & 2) ? AD_DGST : AD_PHYS)
		/* if monsters are moving, one of them caused the destruction */
		if (flags.mon_moving)
		    monkilled(etmp->emon, mk_message(dest), mk_corpse(dest));
		else		/* you caused it */
		    xkilled(etmp->emon, dest);
		etmp->edata = NULL;

		/* dead long worm handling */
		for (entitycnt = 0; entitycnt < ENTITIES; entitycnt++) {
		    if (etmp != &(occupants[entitycnt]) &&
			etmp->emon == occupants[entitycnt].emon)
			occupants[entitycnt].edata = NULL;
		}
#undef mk_message
#undef mk_corpse
	}
}